

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Own<kj::WebSocket> __thiscall
kj::anon_unknown_31::upgradeToWebSocket
          (anon_unknown_31 *this,Own<kj::AsyncIoStream> *stream,HttpInputStreamImpl *httpInput,
          HttpOutputStream *httpOutput,Maybe<kj::EntropySource_&> maskKeyGenerator)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  ArrayDisposer *pAVar3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  AsyncIoStream *pAVar6;
  Own<kj::WebSocket> OVar7;
  Array<unsigned_char> result;
  undefined1 local_78 [32];
  _func_int **local_58;
  _func_int **local_50;
  ArrayDisposer *local_48;
  _func_int **local_40;
  _func_int **local_38;
  
  pp_Var1 = (_func_int **)(httpInput->headerBuffer).ptr;
  pp_Var2 = (_func_int **)(httpInput->headerBuffer).size_;
  pAVar3 = (httpInput->headerBuffer).disposer;
  (httpInput->headerBuffer).ptr = (char *)0x0;
  (httpInput->headerBuffer).size_ = 0;
  pp_Var4 = (_func_int **)(httpInput->leftover).ptr;
  pp_Var5 = (_func_int **)(httpInput->leftover).size_;
  local_78._16_8_ = maskKeyGenerator.ptr;
  local_78._24_8_ = this;
  local_58 = pp_Var1;
  local_50 = pp_Var2;
  local_48 = pAVar3;
  local_40 = pp_Var4;
  local_38 = pp_Var5;
  HttpOutputStream::flush((HttpOutputStream *)local_78);
  OVar7.disposer = (Disposer *)operator_new(0xe0);
  (OVar7.disposer)->_vptr_Disposer = (_func_int **)&PTR_send_004427f8;
  pAVar6 = stream->ptr;
  stream->ptr = (AsyncIoStream *)0x0;
  OVar7.disposer[1]._vptr_Disposer = (_func_int **)stream->disposer;
  OVar7.disposer[2]._vptr_Disposer = (_func_int **)pAVar6;
  OVar7.disposer[3]._vptr_Disposer = (_func_int **)local_78._16_8_;
  *(undefined2 *)&OVar7.disposer[4]._vptr_Disposer = 0;
  *(undefined1 *)((long)&OVar7.disposer[4]._vptr_Disposer + 2) = 0;
  OVar7.disposer[7]._vptr_Disposer = (_func_int **)0x0;
  OVar7.disposer[8]._vptr_Disposer = (_func_int **)0x0;
  OVar7.disposer[9]._vptr_Disposer = (_func_int **)0x0;
  OVar7.disposer[10]._vptr_Disposer = (_func_int **)0x0;
  *(undefined1 *)&OVar7.disposer[0xb]._vptr_Disposer = 0;
  *(undefined1 *)&OVar7.disposer[0xf]._vptr_Disposer = 1;
  OVar7.disposer[0x10]._vptr_Disposer = (_func_int **)local_78._0_8_;
  OVar7.disposer[0x11]._vptr_Disposer = (_func_int **)local_78._8_8_;
  *(undefined4 *)&OVar7.disposer[0x12]._vptr_Disposer = 0;
  OVar7.disposer[0x13]._vptr_Disposer = (_func_int **)0x0;
  OVar7.disposer[0x14]._vptr_Disposer = (_func_int **)0x0;
  OVar7.disposer[0x15]._vptr_Disposer = (_func_int **)0x0;
  OVar7.disposer[0x17]._vptr_Disposer = pp_Var1;
  OVar7.disposer[0x18]._vptr_Disposer = pp_Var2;
  OVar7.disposer[0x19]._vptr_Disposer = (_func_int **)pAVar3;
  OVar7.disposer[0x1a]._vptr_Disposer = pp_Var4;
  OVar7.disposer[0x1b]._vptr_Disposer = pp_Var5;
  *(undefined8 **)local_78._24_8_ =
       &_::HeapDisposer<kj::(anonymous_namespace)::WebSocketImpl>::instance;
  *(Disposer **)(local_78._24_8_ + 8) = OVar7.disposer;
  OVar7.ptr = (WebSocket *)local_78._24_8_;
  return OVar7;
}

Assistant:

kj::Own<WebSocket> upgradeToWebSocket(
    kj::Own<kj::AsyncIoStream> stream, HttpInputStreamImpl& httpInput, HttpOutputStream& httpOutput,
    kj::Maybe<EntropySource&> maskKeyGenerator) {
  // Create a WebSocket upgraded from an HTTP stream.
  auto releasedBuffer = httpInput.releaseBuffer();
  return kj::heap<WebSocketImpl>(kj::mv(stream), maskKeyGenerator,
                                 kj::mv(releasedBuffer.buffer), releasedBuffer.leftover,
                                 httpOutput.flush());
}